

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.hpp
# Opt level: O2

void __thiscall
helics::TimeCoordinator::TimeCoordinator
          (TimeCoordinator *this,
          function<void_(const_helics::ActionMessage_&)> *userSendMessageFunction)

{
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = userSendMessageFunction->_M_invoker;
  p_Var1 = (userSendMessageFunction->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(userSendMessageFunction->super__Function_base)._M_functor;
    local_28._8_8_ =
         *(undefined8 *)((long)&(userSendMessageFunction->super__Function_base)._M_functor + 8);
    (userSendMessageFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userSendMessageFunction->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  BaseTimeCoordinator::BaseTimeCoordinator
            (&this->super_BaseTimeCoordinator,
             (function<void_(const_helics::ActionMessage_&)> *)&local_28);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  (this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator =
       (_func_int **)&PTR__TimeCoordinator_004983c0;
  TimeData::TimeData(&this->upstream);
  TimeData::TimeData(&this->total);
  TimeData::TimeData(&this->lastSend);
  (this->time_granted).internalTimeCode = -0x7fffffffffffffff;
  (this->time_requested).internalTimeCode = 0x7fffffffffffffff;
  (this->time_next).internalTimeCode = 0;
  (this->time_minminDe).internalTimeCode = 0;
  (this->time_minDe).internalTimeCode = 0;
  (this->time_allow).internalTimeCode = -0x7fffffffffffffff;
  (this->time_exec).internalTimeCode = 0x7fffffffffffffff;
  (this->time_message).internalTimeCode = 0x7fffffffffffffff;
  (this->time_value).internalTimeCode = 0x7fffffffffffffff;
  (this->time_grantBase).internalTimeCode = -0x7fffffffffffffff;
  (this->time_block).internalTimeCode = 0x7fffffffffffffff;
  (this->maxTime).internalTimeCode = 0x7fffffffffffffff;
  memset(&this->dependent_federates,0,0x98);
  (this->info).timeDelta.internalTimeCode = 1;
  (this->info).inputDelay.internalTimeCode = 0;
  (this->info).outputDelay.internalTimeCode = 0;
  (this->info).offset.internalTimeCode = 0;
  (this->info).period.internalTimeCode = 0;
  (this->info).wait_for_current_time_updates = false;
  (this->info).uninterruptible = false;
  (this->info).restrictive_time_policy = false;
  (this->info).event_triggered = false;
  (this->info).maxIterations = 0x32;
  this->currentRestrictionLevel = '\0';
  this->iterating = NO_ITERATIONS;
  this->hasInitUpdates = false;
  this->hasIterationData = false;
  this->needSendAll = false;
  this->triggered = false;
  this->globalTime = false;
  this->dynamicJoining = false;
  (this->iteration).super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

explicit TimeCoordinator(std::function<void(const ActionMessage&)> userSendMessageFunction):
        BaseTimeCoordinator(std::move(userSendMessageFunction))
    {
    }